

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void RunFunctionInlining(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  SmallArray<VariableData_*,_4U> *this;
  VmValue *pVVar1;
  ScopeData *pSVar2;
  VariableHandle *pVVar3;
  SynBase *pSVar4;
  TypeBase *pTVar5;
  VmBlock *pVVar6;
  SmallArray<VmValue_*,_4U> *this_00;
  bool bVar7;
  VmValue **ppVVar8;
  VariableData **ppVVar9;
  VmConstant **ppVVar10;
  VmConstant *pVVar11;
  VmConstant *pVVar12;
  VmValue *pVVar13;
  uint i;
  uint uVar14;
  IntrusiveList<VariableHandle> *pIVar15;
  VmConstant *in_R9;
  VmInstruction **ppVVar16;
  VmFunction *pVVar17;
  uint i_2;
  VmType type;
  int in_stack_fffffffffffffd38;
  VmConstant *redirect;
  VmConstant *local_2b0;
  VmFunction *local_2a8;
  TypeBase *local_2a0;
  SmallArray<VmValue_*,_4U> *local_298;
  uint local_28c;
  TypeBase *local_288;
  VmInstruction *instCopy;
  VmConstant *local_278;
  VmConstant *local_270;
  SynBase *local_268;
  SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U> instructionRemap;
  SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U> variableRemap;
  
  if (value == (VmValue *)0x0) {
    return;
  }
  uVar14 = value->typeID;
  if (uVar14 != 2) {
    if (uVar14 == 3) {
      module->currentBlock = (VmBlock *)value;
      pVVar13 = (VmValue *)value[1].comment.end;
      while (pVVar13 != (VmValue *)0x0) {
        pVVar1 = pVVar13[1].users.little[0];
        RunFunctionInlining(ctx,module,pVVar13);
        pVVar13 = pVVar1;
      }
      module->currentBlock = (VmBlock *)0x0;
      return;
    }
    if (uVar14 != 4) {
      return;
    }
    module->currentFunction = (VmFunction *)value;
    pVVar13 = (VmValue *)value[1].source;
    while (pVVar13 != (VmValue *)0x0) {
      pVVar1 = (VmValue *)pVVar13[1].comment.begin;
      RunFunctionInlining(ctx,module,pVVar13);
      pVVar13 = pVVar1;
    }
    module->currentFunction = (VmFunction *)0x0;
    return;
  }
  if (*(int *)&value[1]._vptr_VmValue != 0x1f) {
    return;
  }
  local_298 = (SmallArray<VmValue_*,_4U> *)&value[1].typeID;
  ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](local_298,0);
  this_00 = local_298;
  if (((*ppVVar8)->type).type == VM_TYPE_FUNCTION_REF) {
    return;
  }
  ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](local_298,0);
  pVVar12 = (VmConstant *)*ppVVar8;
  ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](this_00,1);
  pVVar17 = (VmFunction *)*ppVVar8;
  if ((pVVar17 == (VmFunction *)0x0) || ((pVVar17->super_VmValue).typeID != 4)) {
    pVVar17 = (VmFunction *)0x0;
  }
  ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](local_298,2);
  pVVar11 = (VmConstant *)*ppVVar8;
  if ((pVVar11 == (VmConstant *)0x0) || ((pVVar11->super_VmValue).typeID != 1)) {
    pVVar11 = (VmConstant *)0x0;
  }
  if (pVVar17->checkedInline == true) {
    if ((pVVar17->canInline & 1U) == 0) {
      return;
    }
  }
  else {
    pVVar17->checkedInline = true;
    bVar7 = CheckFunctionForInlining(pVVar17);
    pVVar17->canInline = bVar7;
    if (!bVar7) {
      return;
    }
  }
  module->currentBlock->insertPoint = (VmInstruction *)value;
  pSVar2 = pVVar17->scope;
  local_278 = pVVar12;
  SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>::SmallDenseMap
            (&variableRemap,(Allocator *)0x0);
  local_288 = pVVar17->function->type->returnType;
  local_2a8 = pVVar17;
  local_270 = pVVar11;
  if ((local_288 == (TypeBase *)0x0) || (local_288->typeID != 1)) {
    in_R9 = (VmConstant *)0x1;
    local_2b0 = anon_unknown.dwarf_f89de::CreateAlloca
                          (ctx,module,value->source,local_288,"inline_res",true);
  }
  else {
    local_2b0 = (VmConstant *)0x0;
  }
  for (uVar14 = 0; uVar14 < (pSVar2->allVariables).count; uVar14 = uVar14 + 1) {
    ppVVar9 = SmallArray<VariableData_*,_4U>::operator[](&pSVar2->allVariables,uVar14);
    instructionRemap._0_8_ = *ppVVar9;
    if ((((VariableData *)instructionRemap._0_8_)->users).count != 0) {
      in_R9 = (VmConstant *)0x0;
      redirect = anon_unknown.dwarf_f89de::CreateAlloca
                           (ctx,module,((VariableData *)instructionRemap._0_8_)->source,
                            ((VariableData *)instructionRemap._0_8_)->type,"inline_var",false);
      SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>::insert
                (&variableRemap,(VariableData **)&instructionRemap,&redirect);
    }
  }
  this = &local_2a8->allocas;
  for (uVar14 = 0; uVar14 < (local_2a8->allocas).count; uVar14 = uVar14 + 1) {
    ppVVar9 = SmallArray<VariableData_*,_4U>::operator[](this,uVar14);
    instructionRemap._0_8_ = *ppVVar9;
    if (((((VariableData *)instructionRemap._0_8_)->users).count != 0) &&
       (ppVVar10 = SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>::find
                             (&variableRemap,(VariableData **)&instructionRemap),
       ppVVar10 == (VmConstant **)0x0)) {
      in_R9 = (VmConstant *)0x0;
      redirect = anon_unknown.dwarf_f89de::CreateAlloca
                           (ctx,module,*(SynBase **)instructionRemap._0_8_,
                            *(TypeBase **)(instructionRemap._0_8_ + 0x20),"inline_alloca",false);
      SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>::insert
                (&variableRemap,(VariableData **)&instructionRemap,&redirect);
    }
  }
  uVar14 = 3;
  pIVar15 = &local_2a8->function->argumentVariables;
  while (pVVar17 = local_2a8, pVVar3 = pIVar15->head, pVVar3 != (VariableHandle *)0x0) {
    instructionRemap._0_8_ = pVVar3->variable;
    local_28c = uVar14;
    ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](local_298,uVar14);
    if (*(int *)(instructionRemap._0_8_ + 0x50) != 0) {
      pVVar12 = (VmConstant *)*ppVVar8;
      ppVVar10 = SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>::find
                           (&variableRemap,(VariableData **)&instructionRemap);
      if (ppVVar10 == (VmConstant **)0x0) {
        __assert_fail("addressPtr",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x1a21,"void RunFunctionInlining(ExpressionContext &, VmModule *, VmValue *)"
                     );
      }
      if (pVVar12 == (VmConstant *)0x0) {
LAB_00194830:
        pSVar4 = value->source;
        pTVar5 = *(TypeBase **)(instructionRemap._0_8_ + 0x20);
        pVVar11 = CloneRemappedPointer(ctx,*ppVVar10);
        in_stack_fffffffffffffd38 = 0;
        anon_unknown.dwarf_f89de::CreateStore
                  (ctx,module,pSVar4,pTVar5,&pVVar11->super_VmValue,(VmValue *)pVVar12,0);
        in_R9 = pVVar12;
      }
      else {
        uVar14 = (pVVar12->super_VmValue).typeID;
        if (uVar14 == 1) {
          if (pVVar12->isFloat == true) {
            local_2a0 = (TypeBase *)CONCAT44(local_2a0._4_4_,pVVar12->iValue);
            local_268 = value->source;
            pTVar5 = *(TypeBase **)(instructionRemap._0_8_ + 0x20);
            pVVar11 = CloneRemappedPointer(ctx,*ppVVar10);
            in_R9 = CreateConstantDouble
                              (ctx->allocator,(pVVar12->super_VmValue).source,
                               (double)local_2a0._0_4_);
            in_stack_fffffffffffffd38 = 0;
            anon_unknown.dwarf_f89de::CreateStore
                      (ctx,module,local_268,pTVar5,&pVVar11->super_VmValue,&in_R9->super_VmValue,0);
          }
          else if ((pVVar12->super_VmValue).type.size != 0) {
            pSVar4 = value->source;
            pTVar5 = *(TypeBase **)(instructionRemap._0_8_ + 0x20);
            pVVar11 = CloneRemappedPointer(ctx,*ppVVar10);
            in_stack_fffffffffffffd38 = 0;
            anon_unknown.dwarf_f89de::CreateStore
                      (ctx,module,pSVar4,pTVar5,&pVVar11->super_VmValue,(VmValue *)pVVar12,0);
            in_R9 = pVVar12;
          }
        }
        else {
          if (uVar14 != 2) goto LAB_00194830;
          pSVar4 = value->source;
          local_2a0 = *(TypeBase **)(instructionRemap._0_8_ + 0x20);
          if (pVVar12->iValue == 0x11) {
            pVVar11 = CloneRemappedPointer(ctx,*ppVVar10);
            ppVVar8 = SmallArray<VmValue_*,_4U>::operator[]
                                ((SmallArray<VmValue_*,_4U> *)&pVVar12->dValue,0);
            in_R9 = (VmConstant *)*ppVVar8;
            in_stack_fffffffffffffd38 = 0;
            anon_unknown.dwarf_f89de::CreateStore
                      (ctx,module,pSVar4,local_2a0,&pVVar11->super_VmValue,(VmValue *)in_R9,0);
          }
          else {
            pVVar11 = CloneRemappedPointer(ctx,*ppVVar10);
            in_stack_fffffffffffffd38 = 0;
            anon_unknown.dwarf_f89de::CreateStore
                      (ctx,module,pSVar4,local_2a0,&pVVar11->super_VmValue,(VmValue *)pVVar12,0);
            in_R9 = pVVar12;
          }
        }
      }
    }
    uVar14 = local_28c + 1;
    pIVar15 = (IntrusiveList<VariableHandle> *)&pVVar3->next;
  }
  instructionRemap._0_8_ = local_2a8->function->contextArgument;
  if (((VariableData *)instructionRemap._0_8_ != (VariableData *)0x0) &&
     ((((VariableData *)instructionRemap._0_8_)->users).count != 0)) {
    ppVVar10 = SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>::find
                         (&variableRemap,(VariableData **)&instructionRemap);
    if (ppVVar10 == (VmConstant **)0x0) {
      __assert_fail("addressPtr",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x1a45,"void RunFunctionInlining(ExpressionContext &, VmModule *, VmValue *)");
    }
    pSVar4 = value->source;
    pTVar5 = *(TypeBase **)(instructionRemap._0_8_ + 0x20);
    pVVar12 = CloneRemappedPointer(ctx,*ppVVar10);
    in_stack_fffffffffffffd38 = 0;
    in_R9 = local_278;
    anon_unknown.dwarf_f89de::CreateStore
              (ctx,module,pSVar4,pTVar5,&pVVar12->super_VmValue,&local_278->super_VmValue,0);
  }
  pVVar6 = pVVar17->firstBlock;
  if (pVVar6->nextSibling != (VmBlock *)0x0) {
    __assert_fail("!block->nextSibling",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x1a4d,"void RunFunctionInlining(ExpressionContext &, VmModule *, VmValue *)");
  }
  SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U>::SmallDenseMap
            (&instructionRemap,(Allocator *)0x0);
  ppVVar16 = &pVVar6->firstInstruction;
  while( true ) {
    redirect = (VmConstant *)*ppVVar16;
    if ((VmInstruction *)redirect == (VmInstruction *)0x0) break;
    if (((VmInstruction *)redirect)->cmd == VM_INST_RETURN) {
      if (local_2b0 != (VmConstant *)0x0) {
        ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&((VmInstruction *)redirect)->arguments,0);
        in_R9 = (VmConstant *)
                RemapInstructionArgument(ctx,module,*ppVVar8,&variableRemap,&instructionRemap);
        in_stack_fffffffffffffd38 = 0;
        anon_unknown.dwarf_f89de::CreateStore
                  (ctx,module,value->source,local_2a8->function->type->returnType,
                   &local_2b0->super_VmValue,(VmValue *)in_R9,0);
      }
    }
    else {
      type.structType._0_4_ = ((VmInstruction *)redirect)->cmd;
      type._0_8_ = (((VmInstruction *)redirect)->super_VmValue).type.structType;
      type.structType._4_4_ = 0;
      instCopy = anon_unknown.dwarf_f89de::CreateInstruction
                           ((anon_unknown_dwarf_f89de *)module,(VmModule *)value->source,
                            *(SynBase **)&(((VmInstruction *)redirect)->super_VmValue).type,type,
                            (VmInstructionType)in_R9);
      SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U>::insert
                (&instructionRemap,(VmInstruction **)&redirect,&instCopy);
      for (uVar14 = 0; uVar14 < (uint)redirect->lValue; uVar14 = uVar14 + 1) {
        ppVVar8 = SmallArray<VmValue_*,_4U>::operator[]
                            ((SmallArray<VmValue_*,_4U> *)&redirect->dValue,uVar14);
        pVVar13 = RemapInstructionArgument(ctx,module,*ppVVar8,&variableRemap,&instructionRemap);
        VmInstruction::AddArgument(instCopy,pVVar13);
      }
    }
    ppVVar16 = &((VmInstruction *)redirect)->nextSibling;
  }
  if (local_270->container == (VariableData *)0x0) {
    if (local_2b0 != (VmConstant *)0x0) {
      pVVar13 = anon_unknown.dwarf_f89de::CreateLoad
                          (ctx,module,value->source,local_288,&local_2b0->super_VmValue,
                           (VmInstructionType)in_R9);
      anon_unknown.dwarf_f89de::ReplaceValueUsersWith(module,value,pVVar13,(uint *)0x0);
      VmBlock::RemoveInstruction((VmBlock *)value[1].users.data,(VmInstruction *)value);
      goto LAB_00194bbb;
    }
  }
  else {
    pSVar4 = value->source;
    pVVar12 = CloneRemappedPointer(ctx,local_270);
    anon_unknown.dwarf_f89de::CreateMemCopy
              (module,pSVar4,&pVVar12->super_VmValue,0,&local_2b0->super_VmValue,
               (uint)local_288->size,in_stack_fffffffffffffd38);
  }
  VmBlock::RemoveInstruction((VmBlock *)value[1].users.data,(VmInstruction *)value);
LAB_00194bbb:
  module->functionInlines = module->functionInlines + 1;
  module->currentBlock->insertPoint = module->currentBlock->lastInstruction;
  SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U>::~SmallDenseMap
            (&instructionRemap);
  SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>::~SmallDenseMap
            (&variableRemap);
  return;
}

Assistant:

VmValue* CreateOr(VmModule *module, SynBase *source, VmValue *lhs, VmValue *rhs)
	{
		assert(lhs->type == VmType::Int || lhs->type == VmType::Long);
		assert(lhs->type == rhs->type);

		return CreateInstruction(module, source, lhs->type, VM_INST_BIT_OR, lhs, rhs);
	}